

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBody.cpp
# Opt level: O0

void __thiscall
btMultiBody::stepPositionsMultiDof(btMultiBody *this,btScalar dt,btScalar *pq,btScalar *pqd)

{
  int iVar1;
  int iVar2;
  btScalar *pbVar3;
  anon_struct_1_0_00000001 *this_00;
  anon_struct_1_0_00000001 *rotation;
  btMultibodyLink *pbVar4;
  btVector3 *pbVar5;
  anon_struct_1_0_00000001 *in_RDX;
  btScalar *in_RSI;
  long in_RDI;
  btAlignedObjectArray<btMultibodyLink> *this_01;
  float in_XMM0_Da;
  btScalar bVar6;
  btVector3 no_q0_coors_qd1qd2;
  btVector3 q0_coors_qd1qd2;
  btScalar jointVel_1;
  btScalar *pJointVel;
  btScalar *pJointPos;
  int i;
  btScalar *pBaseOmega;
  btScalar *pBaseQuat;
  anon_struct_1_0_00000001 pQuatUpdateFun;
  btScalar *pBaseVel;
  btScalar *pBasePos;
  int num_links;
  undefined4 in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  undefined4 in_stack_fffffffffffffed0;
  float in_stack_fffffffffffffed4;
  btVector3 *v1;
  undefined4 in_stack_fffffffffffffef8;
  eFeatherstoneJointType eVar7;
  btScalar *local_f8;
  anon_struct_1_0_00000001 *local_f0;
  btScalar *local_e8;
  anon_struct_1_0_00000001 *local_e0;
  btScalar *local_d8;
  btVector3 local_b4;
  btScalar local_a4 [4];
  btScalar local_94 [4];
  btScalar local_84 [4];
  float local_74;
  anon_struct_1_0_00000001 *local_70;
  btScalar *local_68;
  int local_60;
  anon_struct_1_0_00000001 *local_50;
  btScalar *local_48;
  undefined4 in_stack_ffffffffffffffd8;
  btScalar *local_18;
  
  iVar1 = getNumLinks((btMultiBody *)0x24051a);
  if (in_RSI == (btScalar *)0x0) {
    local_d8 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x18));
    local_f0 = in_RDX;
  }
  else {
    local_d8 = in_RSI + 4;
    local_f0 = in_RDX;
  }
  if (local_f0 == (anon_struct_1_0_00000001 *)0x0) {
    local_e0 = (anon_struct_1_0_00000001 *)
               btAlignedObjectArray<float>::operator[]
                         ((btAlignedObjectArray<float> *)(in_RDI + 0xf0),3);
  }
  else {
    local_e0 = local_f0 + 0xc;
  }
  *local_d8 = in_XMM0_Da * *(float *)local_e0 + *local_d8;
  local_d8[1] = in_XMM0_Da * *(float *)(local_e0 + 4) + local_d8[1];
  local_d8[2] = in_XMM0_Da * *(float *)(local_e0 + 8) + local_d8[2];
  local_e8 = in_RSI;
  if (in_RSI == (btScalar *)0x0) {
    local_e8 = btQuadWord::operator_cast_to_float_((btQuadWord *)(in_RDI + 0x28));
  }
  local_48 = local_e8;
  this_00 = local_f0;
  if (local_f0 == (anon_struct_1_0_00000001 *)0x0) {
    local_f0 = (anon_struct_1_0_00000001 *)
               btAlignedObjectArray<float>::operator[]
                         ((btAlignedObjectArray<float> *)(in_RDI + 0xf0),0);
  }
  local_50 = local_f0;
  if ((stepPositionsMultiDof(float,float*,float*)::baseQuat == '\0') &&
     (iVar2 = __cxa_guard_acquire(&stepPositionsMultiDof(float,float*,float*)::baseQuat), iVar2 != 0
     )) {
    btQuaternion::btQuaternion((btQuaternion *)0x2406d1);
    __cxa_guard_release(&stepPositionsMultiDof(float,float*,float*)::baseQuat);
  }
  btQuadWord::setValue
            (&stepPositionsMultiDof::baseQuat.super_btQuadWord,local_48,local_48 + 1,local_48 + 2,
             local_48 + 3);
  if ((stepPositionsMultiDof(float,float*,float*)::baseOmega == '\0') &&
     (iVar2 = __cxa_guard_acquire(&stepPositionsMultiDof(float,float*,float*)::baseOmega),
     iVar2 != 0)) {
    btVector3::btVector3(&stepPositionsMultiDof::baseOmega);
    __cxa_guard_release(&stepPositionsMultiDof(float,float*,float*)::baseOmega);
  }
  btVector3::setValue(&stepPositionsMultiDof::baseOmega,(btScalar *)local_50,
                      (btScalar *)(local_50 + 4),(btScalar *)(local_50 + 8));
  stepPositionsMultiDof::anon_struct_1_0_00000001::operator()
            (this_00,(btVector3 *)CONCAT44(iVar1,in_stack_ffffffffffffffd8),(btQuaternion *)local_d8
             ,SUB81((ulong)local_e0 >> 0x38,0),SUB84(local_e0,0));
  pbVar3 = btQuadWord::x(&stepPositionsMultiDof::baseQuat.super_btQuadWord);
  *local_48 = *pbVar3;
  pbVar3 = btQuadWord::y(&stepPositionsMultiDof::baseQuat.super_btQuadWord);
  local_48[1] = *pbVar3;
  pbVar3 = btQuadWord::z(&stepPositionsMultiDof::baseQuat.super_btQuadWord);
  local_48[2] = *pbVar3;
  pbVar3 = btQuadWord::w(&stepPositionsMultiDof::baseQuat.super_btQuadWord);
  local_48[3] = *pbVar3;
  local_18 = in_RSI;
  if (in_RSI != (btScalar *)0x0) {
    local_18 = in_RSI + 7;
  }
  if (this_00 != (anon_struct_1_0_00000001 *)0x0) {
    this_00 = this_00 + 0x18;
  }
  for (local_60 = 0; local_60 < iVar1; local_60 = local_60 + 1) {
    if (local_18 == (btScalar *)0x0) {
      pbVar4 = btAlignedObjectArray<btMultibodyLink>::operator[]
                         ((btAlignedObjectArray<btMultibodyLink> *)(in_RDI + 0x90),local_60);
      local_f8 = pbVar4->m_jointPos;
      rotation = this_00;
    }
    else {
      local_f8 = local_18;
      rotation = this_00;
    }
    local_68 = local_f8;
    this_00 = rotation;
    if (rotation == (anon_struct_1_0_00000001 *)0x0) {
      rotation = (anon_struct_1_0_00000001 *)
                 getJointVelMultiDof((btMultiBody *)
                                     CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                                     in_stack_fffffffffffffecc);
    }
    local_70 = rotation;
    pbVar4 = btAlignedObjectArray<btMultibodyLink>::operator[]
                       ((btAlignedObjectArray<btMultibodyLink> *)(in_RDI + 0x90),local_60);
    eVar7 = pbVar4->m_jointType;
    if (eVar7 < eSpherical) {
      local_74 = *(float *)local_70;
      *local_68 = in_XMM0_Da * local_74 + *local_68;
    }
    else if (eVar7 == eSpherical) {
      if ((stepPositionsMultiDof(float,float*,float*)::jointVel == '\0') &&
         (iVar2 = __cxa_guard_acquire(&stepPositionsMultiDof(float,float*,float*)::jointVel),
         iVar2 != 0)) {
        btVector3::btVector3(&stepPositionsMultiDof::jointVel);
        __cxa_guard_release(&stepPositionsMultiDof(float,float*,float*)::jointVel);
      }
      btVector3::setValue(&stepPositionsMultiDof::jointVel,(btScalar *)local_70,
                          (btScalar *)(local_70 + 4),(btScalar *)(local_70 + 8));
      if ((stepPositionsMultiDof(float,float*,float*)::jointOri == '\0') &&
         (iVar2 = __cxa_guard_acquire(&stepPositionsMultiDof(float,float*,float*)::jointOri),
         iVar2 != 0)) {
        btQuaternion::btQuaternion((btQuaternion *)0x240a53);
        __cxa_guard_release(&stepPositionsMultiDof(float,float*,float*)::jointOri);
      }
      btQuadWord::setValue
                (&stepPositionsMultiDof::jointOri.super_btQuadWord,local_68,local_68 + 1,
                 local_68 + 2,local_68 + 3);
      stepPositionsMultiDof::anon_struct_1_0_00000001::operator()
                (this_00,(btVector3 *)CONCAT44(iVar1,in_stack_ffffffffffffffd8),
                 (btQuaternion *)local_d8,SUB81((ulong)local_e0 >> 0x38,0),SUB84(local_e0,0));
      pbVar3 = btQuadWord::x(&stepPositionsMultiDof::jointOri.super_btQuadWord);
      *local_68 = *pbVar3;
      pbVar3 = btQuadWord::y(&stepPositionsMultiDof::jointOri.super_btQuadWord);
      local_68[1] = *pbVar3;
      pbVar3 = btQuadWord::z(&stepPositionsMultiDof::jointOri.super_btQuadWord);
      local_68[2] = *pbVar3;
      pbVar3 = btQuadWord::w(&stepPositionsMultiDof::jointOri.super_btQuadWord);
      local_68[3] = *pbVar3;
    }
    else if (eVar7 == ePlanar) {
      in_stack_fffffffffffffed4 = in_XMM0_Da;
      pbVar3 = getJointVelMultiDof((btMultiBody *)CONCAT44(in_XMM0_Da,in_stack_fffffffffffffed0),
                                   in_stack_fffffffffffffecc);
      *local_68 = in_stack_fffffffffffffed4 * *pbVar3 + *local_68;
      pbVar3 = getJointVelMultiDof((btMultiBody *)
                                   CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                                   in_stack_fffffffffffffecc);
      pbVar5 = (btVector3 *)(pbVar3 + 1);
      this_01 = (btAlignedObjectArray<btMultibodyLink> *)(in_RDI + 0x90);
      pbVar4 = btAlignedObjectArray<btMultibodyLink>::operator[](this_01,local_60);
      btMultibodyLink::getAxisBottom(pbVar4,1);
      local_94 = (btScalar  [4])
                 ::operator*((btScalar *)
                             CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                             (btVector3 *)
                             CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      pbVar3 = getJointVelMultiDof((btMultiBody *)
                                   CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                                   in_stack_fffffffffffffecc);
      v1 = (btVector3 *)(pbVar3 + 2);
      pbVar4 = btAlignedObjectArray<btMultibodyLink>::operator[](this_01,local_60);
      btMultibodyLink::getAxisBottom(pbVar4,2);
      local_a4 = (btScalar  [4])
                 ::operator*((btScalar *)
                             CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                             (btVector3 *)
                             CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      local_84 = (btScalar  [4])operator+(v1,pbVar5);
      pbVar4 = btAlignedObjectArray<btMultibodyLink>::operator[](this_01,local_60);
      btMultibodyLink::getAxisTop(pbVar4,0);
      btQuaternion::btQuaternion
                ((btQuaternion *)v1,pbVar5,
                 (btScalar *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
      local_b4 = quatRotate((btQuaternion *)rotation,
                            (btVector3 *)CONCAT44(eVar7,in_stack_fffffffffffffef8));
      pbVar4 = btAlignedObjectArray<btMultibodyLink>::operator[]
                         ((btAlignedObjectArray<btMultibodyLink> *)(in_RDI + 0x90),local_60);
      pbVar5 = btMultibodyLink::getAxisBottom(pbVar4,1);
      bVar6 = btVector3::dot(pbVar5,&local_b4);
      local_68[1] = bVar6 * in_XMM0_Da + local_68[1];
      pbVar4 = btAlignedObjectArray<btMultibodyLink>::operator[]
                         ((btAlignedObjectArray<btMultibodyLink> *)(in_RDI + 0x90),local_60);
      pbVar5 = btMultibodyLink::getAxisBottom(pbVar4,2);
      bVar6 = btVector3::dot(pbVar5,&local_b4);
      local_68[2] = bVar6 * in_XMM0_Da + local_68[2];
    }
    btAlignedObjectArray<btMultibodyLink>::operator[]
              ((btAlignedObjectArray<btMultibodyLink> *)(in_RDI + 0x90),local_60);
    btMultibodyLink::updateCacheMultiDof((btMultibodyLink *)pBaseQuat,pBaseOmega);
    if (local_18 != (btScalar *)0x0) {
      pbVar4 = btAlignedObjectArray<btMultibodyLink>::operator[]
                         ((btAlignedObjectArray<btMultibodyLink> *)(in_RDI + 0x90),local_60);
      local_18 = local_18 + pbVar4->m_posVarCount;
    }
    if (this_00 != (anon_struct_1_0_00000001 *)0x0) {
      pbVar4 = btAlignedObjectArray<btMultibodyLink>::operator[]
                         ((btAlignedObjectArray<btMultibodyLink> *)(in_RDI + 0x90),local_60);
      this_00 = this_00 + (long)pbVar4->m_dofCount * 4;
    }
  }
  return;
}

Assistant:

void btMultiBody::stepPositionsMultiDof(btScalar dt, btScalar *pq, btScalar *pqd)
{	
	int num_links = getNumLinks();
    // step position by adding dt * velocity
	//btVector3 v = getBaseVel();	
    //m_basePos += dt * v;
	//
	btScalar *pBasePos = (pq ? &pq[4] : m_basePos);
	btScalar *pBaseVel = (pqd ? &pqd[3] : &m_realBuf[3]);			//note: the !pqd case assumes m_realBuf holds with base velocity at 3,4,5 (should be wrapped for safety)
	//	
	pBasePos[0] += dt * pBaseVel[0];
	pBasePos[1] += dt * pBaseVel[1];
	pBasePos[2] += dt * pBaseVel[2];

	///////////////////////////////
	//local functor for quaternion integration (to avoid error prone redundancy)
	struct
	{
		//"exponential map" based on btTransformUtil::integrateTransform(..)
		void operator() (const btVector3 &omega, btQuaternion &quat, bool baseBody, btScalar dt)
		{
			//baseBody	=>	quat is alias and omega is global coor
			//!baseBody	=>	quat is alibi and omega is local coor	
			
			btVector3 axis;
			btVector3 angvel;

			if(!baseBody)			
				angvel = quatRotate(quat, omega);				//if quat is not m_baseQuat, it is alibi => ok			
			else
				angvel = omega;
		
			btScalar fAngle = angvel.length(); 		
			//limit the angular motion
			if (fAngle * dt > ANGULAR_MOTION_THRESHOLD)
			{
				fAngle = btScalar(0.5)*SIMD_HALF_PI / dt;
			}

			if ( fAngle < btScalar(0.001) )
			{
				// use Taylor's expansions of sync function
				axis   = angvel*( btScalar(0.5)*dt-(dt*dt*dt)*(btScalar(0.020833333333))*fAngle*fAngle );
			}
			else
			{
				// sync(fAngle) = sin(c*fAngle)/t
				axis   = angvel*( btSin(btScalar(0.5)*fAngle*dt)/fAngle );
			}
			
			if(!baseBody)				
				quat = btQuaternion(axis.x(),axis.y(),axis.z(),btCos( fAngle*dt*btScalar(0.5) )) * quat;			
			else			
				quat = quat * btQuaternion(-axis.x(),-axis.y(),-axis.z(),btCos( fAngle*dt*btScalar(0.5) ));
				//equivalent to: quat = (btQuaternion(axis.x(),axis.y(),axis.z(),btCos( fAngle*dt*btScalar(0.5) )) * quat.inverse()).inverse();			
		
			quat.normalize();
		}
	} pQuatUpdateFun;
	///////////////////////////////

	//pQuatUpdateFun(getBaseOmega(), m_baseQuat, true, dt);
	//	
	btScalar *pBaseQuat = pq ? pq : m_baseQuat;	
	btScalar *pBaseOmega = pqd ? pqd : &m_realBuf[0];		//note: the !pqd case assumes m_realBuf starts with base omega (should be wrapped for safety)
	//
	static btQuaternion baseQuat; baseQuat.setValue(pBaseQuat[0], pBaseQuat[1], pBaseQuat[2], pBaseQuat[3]);
	static btVector3 baseOmega; baseOmega.setValue(pBaseOmega[0], pBaseOmega[1], pBaseOmega[2]);
	pQuatUpdateFun(baseOmega, baseQuat, true, dt);
	pBaseQuat[0] = baseQuat.x();
	pBaseQuat[1] = baseQuat.y();
	pBaseQuat[2] = baseQuat.z();
	pBaseQuat[3] = baseQuat.w();


	//printf("pBaseOmega = %.4f %.4f %.4f\n", pBaseOmega->x(), pBaseOmega->y(), pBaseOmega->z());
	//printf("pBaseVel = %.4f %.4f %.4f\n", pBaseVel->x(), pBaseVel->y(), pBaseVel->z());
	//printf("baseQuat = %.4f %.4f %.4f %.4f\n", pBaseQuat->x(), pBaseQuat->y(), pBaseQuat->z(), pBaseQuat->w());

	if(pq)		
		pq += 7;
	if(pqd)
		pqd += 6;

	// Finally we can update m_jointPos for each of the m_links
    for (int i = 0; i < num_links; ++i) 
	{
		btScalar *pJointPos = (pq ? pq : &m_links[i].m_jointPos[0]);		
		btScalar *pJointVel = (pqd ? pqd : getJointVelMultiDof(i));

		switch(m_links[i].m_jointType)
		{
			case btMultibodyLink::ePrismatic:
			case btMultibodyLink::eRevolute:
			{
				btScalar jointVel = pJointVel[0];	
				pJointPos[0] += dt * jointVel;
				break;
			}
			case btMultibodyLink::eSpherical:
			{
				static btVector3 jointVel; jointVel.setValue(pJointVel[0], pJointVel[1], pJointVel[2]);
				static btQuaternion jointOri; jointOri.setValue(pJointPos[0], pJointPos[1], pJointPos[2], pJointPos[3]);
				pQuatUpdateFun(jointVel, jointOri, false, dt);
				pJointPos[0] = jointOri.x(); pJointPos[1] = jointOri.y(); pJointPos[2] = jointOri.z(); pJointPos[3] = jointOri.w();
				break;
			}
			case btMultibodyLink::ePlanar:
			{
				pJointPos[0] += dt * getJointVelMultiDof(i)[0];

				btVector3 q0_coors_qd1qd2 = getJointVelMultiDof(i)[1] * m_links[i].getAxisBottom(1) + getJointVelMultiDof(i)[2] * m_links[i].getAxisBottom(2);
				btVector3 no_q0_coors_qd1qd2 = quatRotate(btQuaternion(m_links[i].getAxisTop(0), pJointPos[0]), q0_coors_qd1qd2);
				pJointPos[1] += m_links[i].getAxisBottom(1).dot(no_q0_coors_qd1qd2) * dt;
				pJointPos[2] += m_links[i].getAxisBottom(2).dot(no_q0_coors_qd1qd2) * dt;

				break;
			}
			default:
			{
			}

		}

		m_links[i].updateCacheMultiDof(pq);

		if(pq)		
			pq += m_links[i].m_posVarCount;
		if(pqd)
			pqd += m_links[i].m_dofCount;
    }
}